

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void Qiniu_Use_Zone_Huanan(Qiniu_Bool useHttps)

{
  Qiniu_Bool useHttps_local;
  
  if (useHttps == 1) {
    QINIU_RS_HOST = "https://rs-z2.qbox.me";
    QINIU_RSF_HOST = "https://rsf-z2.qbox.me";
    QINIU_API_HOST = "https://api-z2.qiniu.com";
    QINIU_UP_HOST = "https://upload-z2.qiniup.com";
    QINIU_IOVIP_HOST = "https://iovip-z2.qbox.me";
  }
  else {
    QINIU_RS_HOST = "http://rs-z2.qbox.me";
    QINIU_RSF_HOST = "http://rsf-z2.qbox.me";
    QINIU_API_HOST = "http://api-z2.qiniu.com";
    QINIU_UP_HOST = "http://upload-z2.qiniup.com";
    QINIU_IOVIP_HOST = "http://iovip-z2.qbox.me";
  }
  return;
}

Assistant:

void Qiniu_Use_Zone_Huanan(Qiniu_Bool useHttps)
{
    if (useHttps == Qiniu_True)
    {
        QINIU_RS_HOST = "https://rs-z2.qbox.me";
        QINIU_RSF_HOST = "https://rsf-z2.qbox.me";
        QINIU_API_HOST = "https://api-z2.qiniu.com";
        QINIU_UP_HOST = "https://upload-z2.qiniup.com";
        QINIU_IOVIP_HOST = "https://iovip-z2.qbox.me";
    }
    else
    {
        QINIU_RS_HOST = "http://rs-z2.qbox.me";
        QINIU_RSF_HOST = "http://rsf-z2.qbox.me";
        QINIU_API_HOST = "http://api-z2.qiniu.com";
        QINIU_UP_HOST = "http://upload-z2.qiniup.com";
        QINIU_IOVIP_HOST = "http://iovip-z2.qbox.me";
    }
}